

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_create(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *seckey)

{
  int iVar1;
  undefined1 local_a0 [4];
  int ret;
  secp256k1_scalar seckey_scalar;
  secp256k1_ge p;
  uchar *seckey_local;
  secp256k1_pubkey *pubkey_local;
  secp256k1_context *ctx_local;
  
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    memset(pubkey,0,0x40);
    iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
    if (iVar1 == 0) {
      secp256k1_callback_call
                (&ctx->illegal_callback,
                 "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)");
      ctx_local._4_4_ = 0;
    }
    else if (seckey == (uchar *)0x0) {
      secp256k1_callback_call(&ctx->illegal_callback,"seckey != NULL");
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ =
           secp256k1_ec_pubkey_create_helper
                     (&ctx->ecmult_gen_ctx,(secp256k1_scalar *)local_a0,
                      (secp256k1_ge *)(seckey_scalar.d + 3),seckey);
      secp256k1_pubkey_save(pubkey,(secp256k1_ge *)(seckey_scalar.d + 3));
      memczero(pubkey,0x40,(uint)((ctx_local._4_4_ != 0 ^ 0xffU) & 1));
      secp256k1_scalar_clear((secp256k1_scalar *)local_a0);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_pubkey_create(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *seckey) {
    secp256k1_ge p;
    secp256k1_scalar seckey_scalar;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &seckey_scalar, &p, seckey);
    secp256k1_pubkey_save(pubkey, &p);
    memczero(pubkey, sizeof(*pubkey), !ret);

    secp256k1_scalar_clear(&seckey_scalar);
    return ret;
}